

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O0

void ecs_query_group_by(ecs_world_t *world,ecs_query_t *query,ecs_entity_t sort_component,
                       ecs_rank_type_action_t group_table_action)

{
  ecs_rank_type_action_t group_table_action_local;
  ecs_entity_t sort_component_local;
  ecs_query_t *query_local;
  ecs_world_t *world_local;
  
  _ecs_assert(query != (ecs_query_t *)0x0,2,(char *)0x0,"query != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
              ,0xba4);
  if (query == (ecs_query_t *)0x0) {
    __assert_fail("query != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0xba4,
                  "void ecs_query_group_by(ecs_world_t *, ecs_query_t *, ecs_entity_t, ecs_rank_type_action_t)"
                 );
  }
  _ecs_assert((_Bool)(((query->flags & 0x200) != 0 ^ 0xffU) & 1),2,(char *)0x0,
              "!(query->flags & EcsQueryIsOrphaned)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
              ,0xba5);
  if ((query->flags & 0x200) == 0) {
    _ecs_assert((query->flags & 1) != 0,2,(char *)0x0,"query->flags & EcsQueryNeedsTables",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                ,0xba6);
    if ((query->flags & 1) != 0) {
      query->rank_on_component = sort_component;
      query->group_table = group_table_action;
      group_tables(world,query);
      order_ranked_tables(world,query);
      build_sorted_tables(query);
      return;
    }
    __assert_fail("query->flags & (1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0xba6,
                  "void ecs_query_group_by(ecs_world_t *, ecs_query_t *, ecs_entity_t, ecs_rank_type_action_t)"
                 );
  }
  __assert_fail("!(query->flags & (512))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                ,0xba5,
                "void ecs_query_group_by(ecs_world_t *, ecs_query_t *, ecs_entity_t, ecs_rank_type_action_t)"
               );
}

Assistant:

void ecs_query_group_by(
    ecs_world_t *world,
    ecs_query_t *query,
    ecs_entity_t sort_component,
    ecs_rank_type_action_t group_table_action)
{
    ecs_assert(query != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(!(query->flags & EcsQueryIsOrphaned), ECS_INVALID_PARAMETER, NULL);    
    ecs_assert(query->flags & EcsQueryNeedsTables, ECS_INVALID_PARAMETER, NULL);

    query->rank_on_component = sort_component;
    query->group_table = group_table_action;

    group_tables(world, query);

    order_ranked_tables(world, query);

    build_sorted_tables(query);
}